

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericvar.cpp
# Opt level: O1

double __thiscall MetaSim::GenericVar::get(GenericVar *this)

{
  _Rb_tree_node_base *p_Var1;
  Exc *this_00;
  _Rb_tree_header *p_Var2;
  double dVar3;
  double dVar4;
  string local_68;
  string local_48;
  
  dVar3 = UniformVar::get(&this->super_UniformVar);
  p_Var1 = (this->_pdf)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->_pdf)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    dVar4 = 0.0;
    do {
      dVar4 = dVar4 + (double)p_Var1[1]._M_parent;
      if (dVar3 < dVar4) {
        return (double)(int)p_Var1[1]._M_color;
      }
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  this_00 = (Exc *)__cxa_allocate_exception(0x30);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Panic","");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"GenericVar","");
  RandomVar::Exc::Exc(this_00,&local_48,&local_68);
  __cxa_throw(this_00,&RandomVar::Exc::typeinfo,BaseExc::~BaseExc);
}

Assistant:

double GenericVar::get()
    {
        double v, CDF;
        map<int, double>::iterator i;

        v = UniformVar::get();
        CDF = 0;

        for(i = _pdf.begin(); i != _pdf.end(); i++) {
            CDF = CDF + i->second;
            if (CDF > v) {
                return i->first;
            }
        }

        /* We cannot arrive here... */
        /* It means that v > 1 or that lim_{i -> \infty} CDF < 1... */
        throw Exc("Panic", "GenericVar");
    }